

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::Cord::AppendImpl<absl::Cord_const&>(Cord *this,Cord *src)

{
  byte bVar1;
  CordRep *pCVar2;
  CordRep *pCVar3;
  ulong uVar4;
  size_t sVar5;
  undefined8 uVar6;
  byte bVar7;
  ulong uVar8;
  uint8_t *puVar9;
  CordRep *pCVar10;
  long in_FS_OFFSET;
  bool bVar11;
  string_view src_00;
  string_view src_01;
  ChunkIterator __begin0;
  anon_union_16_2_39e9c77e_for_Rep_0 local_b8;
  undefined8 local_a8;
  size_t sStack_a0;
  CordRepBtreeReader local_98;
  
  bVar7 = (this->contents_).data_.rep_.field_0.data[0];
  pCVar10 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar10 != (CordRep *)0x0 && (bVar7 & 1) != 0) && (pCVar10->length == 0)) goto LAB_00171516;
  do {
    bVar1 = (byte)((CordRepBtreeReader *)src)->remaining_;
    uVar4 = (ulong)(char)bVar1;
    if ((uVar4 & 1) == 0) {
      uVar8 = uVar4 >> 1;
    }
    else {
      uVar8 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    if (uVar8 == 0) {
      return;
    }
    if ((bVar7 & 1) == 0) {
      uVar8 = (ulong)(long)(char)bVar7 >> 1;
    }
    else {
      uVar8 = pCVar10->length;
    }
    if (uVar8 == 0) {
      if ((bVar1 & 1) == 0) {
        pCVar10 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info =
             ((CordRepBtreeReader *)src)->remaining_;
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar10;
      }
      else {
        pCVar10 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        if (pCVar10 == (CordRep *)0x0) goto LAB_0017160d;
        LOCK();
        (pCVar10->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar10->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        if (pCVar10->tag == '\x02') {
          pCVar3 = (CordRep *)pCVar10[1].length;
          if ((pCVar10->refcount).count_.super___atomic_base<int>._M_i == 2) {
            if (pCVar10->tag != '\x02') goto LAB_0017166a;
            crc_internal::CrcCordState::~CrcCordState((CrcCordState *)&pCVar10[1].refcount);
            operator_delete(pCVar10,0x20);
            pCVar10 = pCVar3;
            if (pCVar3 == (CordRep *)0x0) {
              __assert_fail("rep",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.h"
                            ,0x4ed,
                            "void absl::Cord::InlineRep::EmplaceTree(CordRep * _Nonnull, MethodIdentifier)"
                           );
            }
          }
          else {
            if (pCVar3 == (CordRep *)0x0) goto LAB_0017160d;
            LOCK();
            (pCVar3->refcount).count_.super___atomic_base<int>._M_i =
                 (pCVar3->refcount).count_.super___atomic_base<int>._M_i + 2;
            UNLOCK();
            cord_internal::CordRep::Unref(pCVar10);
            pCVar10 = pCVar3;
          }
        }
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar10;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
        if (*(long *)(in_FS_OFFSET + -0x30) < 2) {
          AppendImpl<absl::Cord_const&>();
        }
        else {
          *(long *)(in_FS_OFFSET + -0x30) = *(long *)(in_FS_OFFSET + -0x30) + -1;
        }
      }
      return;
    }
    if ((uVar4 & 1) == 0) {
      uVar4 = uVar4 >> 1;
    }
    else {
      uVar4 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    bVar11 = (bVar1 & 1) == 0;
    pCVar10 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
    if (0x1ff < uVar4) {
      if (pCVar10 == (CordRep *)0x0 || bVar11) {
LAB_0017160d:
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                      ,0x38f,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      (pCVar10->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar10->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      if (pCVar10->tag == '\x02') {
        pCVar2 = (CordRep *)pCVar10[1].length;
        if ((pCVar10->refcount).count_.super___atomic_base<int>._M_i == 2) {
          if (pCVar10->tag != '\x02') {
LAB_0017166a:
            __assert_fail("IsCrc()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_crc.h"
                          ,0x5a,"CordRepCrc *absl::cord_internal::CordRep::crc()");
          }
          AppendImpl<absl::Cord_const&>((Cord *)pCVar10);
          pCVar10 = pCVar2;
        }
        else {
          if (pCVar2 == (CordRep *)0x0) goto LAB_0017160d;
          LOCK();
          (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
               (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
          UNLOCK();
          cord_internal::CordRep::Unref(pCVar10);
          pCVar10 = pCVar2;
        }
      }
      InlineRep::AppendTree(&this->contents_,pCVar10,kAppendCord);
      return;
    }
    if (pCVar10 == (CordRep *)0x0 || bVar11) {
      puVar9 = (uint8_t *)0x0;
      if ((bVar1 & 1) == 0) {
        puVar9 = (uint8_t *)((long)&((CordRepBtreeReader *)src)->remaining_ + 1);
      }
LAB_001713fd:
      src_00._M_str = (char *)puVar9;
      src_00._M_len = uVar4;
      InlineRep::AppendArray(&this->contents_,src_00,kAppendCord);
      return;
    }
    if (5 < pCVar10->tag) {
      if (0xf8 < pCVar10->tag) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      puVar9 = pCVar10->storage;
      goto LAB_001713fd;
    }
    if (src == this) {
      Cord((Cord *)&local_b8.as_tree,src);
      AppendImpl<absl::Cord>(this,(Cord *)&local_b8.as_tree);
      ~Cord((Cord *)&local_b8.as_tree);
      return;
    }
    local_a8 = 0;
    local_b8 = (anon_union_16_2_39e9c77e_for_Rep_0)ZEXT816(0);
    local_98.remaining_ = 0;
    local_98.navigator_.height_ = -1;
    sStack_a0 = pCVar10->length;
    if (sStack_a0 == 0) {
      return;
    }
    ChunkIterator::InitTree((ChunkIterator *)&local_b8.as_tree,pCVar10);
    if (sStack_a0 == 0) {
      return;
    }
    src = (Cord *)&local_98;
    uVar6 = local_b8.as_tree.cordz_info;
    while( true ) {
      src_01._M_str = (char *)local_b8.as_tree.rep;
      src_01._M_len = uVar6;
      InlineRep::AppendArray(&this->contents_,src_01,kAppendString);
      if (sStack_a0 == 0) break;
      sVar5 = sStack_a0 - local_b8._0_8_;
      if (sStack_a0 < (ulong)local_b8.as_tree.cordz_info) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.h"
                      ,0x616,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      uVar6 = sStack_a0;
      sStack_a0 = sVar5;
      if (sVar5 != 0) {
        if (((long)local_98.navigator_.height_ < 0) ||
           (local_98.navigator_.node_[local_98.navigator_.height_] == (CordRepBtree *)0x0)) {
          if (local_b8.as_tree.cordz_info == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.h"
                          ,0x61c,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_b8 = (anon_union_16_2_39e9c77e_for_Rep_0)ZEXT816(0);
          uVar6 = 0;
        }
        else {
          local_b8.as_tree =
               (AsTree)cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)src);
          uVar6 = local_b8.as_tree.cordz_info;
        }
      }
      if (sStack_a0 == 0) {
        return;
      }
    }
    AppendImpl<absl::Cord_const&>();
LAB_00171516:
    AppendImpl<absl::Cord_const&>();
    pCVar10 = (CordRep *)0x0;
    bVar7 = 0;
  } while( true );
}

Assistant:

inline void Cord::AppendImpl(C&& src) {
  auto constexpr method = CordzUpdateTracker::kAppendCord;

  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  if (empty()) {
    // Since destination is empty, we can avoid allocating a node,
    if (src.contents_.is_tree()) {
      // by taking the tree directly
      CordRep* rep =
          cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
      contents_.EmplaceTree(rep, method);
    } else {
      // or copying over inline data
      contents_.data_ = src.contents_.data_;
    }
    return;
  }

  // For short cords, it is faster to copy data if there is room in dst.
  const size_t src_size = src.contents_.size();
  if (src_size <= kMaxBytesToCopy) {
    CordRep* src_tree = src.contents_.tree();
    if (src_tree == nullptr) {
      // src has embedded data.
      contents_.AppendArray({src.contents_.data(), src_size}, method);
      return;
    }
    if (src_tree->IsFlat()) {
      // src tree just has one flat node.
      contents_.AppendArray({src_tree->flat()->Data(), src_size}, method);
      return;
    }
    if (&src == this) {
      // ChunkIterator below assumes that src is not modified during traversal.
      Append(Cord(src));
      return;
    }
    // TODO(mec): Should we only do this if "dst" has space?
    for (absl::string_view chunk : src.Chunks()) {
      Append(chunk);
    }
    return;
  }

  // Guaranteed to be a tree (kMaxBytesToCopy > kInlinedSize)
  CordRep* rep = cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
  contents_.AppendTree(rep, CordzUpdateTracker::kAppendCord);
}